

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O1

HRESULT utf8::
        NarrowWideStringConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
        ConvertNoAlloc(LPCWSTR sourceString,size_t sourceCount,LPSTR destStringPtr,size_t destCount,
                      size_t *written)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  size_t sVar4;
  undefined4 *puVar5;
  
  HVar3 = -0x7ff8fff2;
  if (sourceCount < 0xffffffff) {
    if (destStringPtr == (LPSTR)0x0) {
      sVar4 = CountTrueUtf8(sourceString,(charcount_t)sourceCount);
    }
    else {
      sVar4 = EncodeInto<(utf8::Utf8EncodingKind)1>
                        ((utf8char_t *)destStringPtr,destCount,sourceString,(charcount_t)sourceCount
                        );
      if (destCount < sVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                           ,0x5c,"(cbEncoded <= destCount)","cbEncoded <= destCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    HVar3 = 0;
    if (written != (size_t *)0x0) {
      *written = sVar4;
      HVar3 = 0;
    }
  }
  return HVar3;
}

Assistant:

static HRESULT ConvertNoAlloc(
            LPCWSTR sourceString, size_t sourceCount,
            LPSTR destStringPtr, size_t destCount, size_t* written)
        {
            return WideStringToNarrowNoAlloc(
                sourceString, sourceCount, destStringPtr, destCount, written);
        }